

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::Value::removeMember(Value *this,char *key)

{
  ValueType VVar1;
  size_t sVar2;
  undefined1 local_1d0 [8];
  CZString actualKey;
  ostringstream local_190 [8];
  OStringStream oss;
  char *key_local;
  Value *this_local;
  
  VVar1 = type(this);
  if ((VVar1 != nullValue) && (VVar1 = type(this), VVar1 != objectValue)) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::operator<<((ostream *)local_190,"in Json::Value::removeMember(): requires objectValue");
    std::__cxx11::ostringstream::str();
    throwLogicError((String *)&actualKey.field_1.storage_);
  }
  VVar1 = type(this);
  if (VVar1 != nullValue) {
    sVar2 = strlen(key);
    CZString::CZString((CZString *)local_1d0,key,(uint)sVar2,noDuplication);
    std::
    map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
    ::erase((this->value_).map_,(CZString *)local_1d0);
    CZString::~CZString((CZString *)local_1d0);
  }
  return;
}

Assistant:

void Value::removeMember(const char* key) {
  JSON_ASSERT_MESSAGE(type() == nullValue || type() == objectValue,
                      "in Json::Value::removeMember(): requires objectValue");
  if (type() == nullValue)
    return;

  CZString actualKey(key, unsigned(strlen(key)), CZString::noDuplication);
  value_.map_->erase(actualKey);
}